

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_mbox_core_stats.cpp
# Opt level: O0

void __thiscall
so_5::stats::impl::ds_mbox_core_stats_t::distribute
          (ds_mbox_core_stats_t *this,mbox_t *distribution_mbox)

{
  mbox_core_stats_t to;
  suffix_t local_58;
  prefix_t local_50;
  size_t local_20;
  mbox_core_stats_t stats;
  mbox_t *distribution_mbox_local;
  ds_mbox_core_stats_t *this_local;
  
  stats.m_named_mbox_count = (size_t)distribution_mbox;
  local_20 = (size_t)so_5::impl::mbox_core_t::query_stats(this->m_what);
  to.m_named_mbox_count = stats.m_named_mbox_count;
  prefixes::mbox_repository();
  local_58 = suffixes::named_mbox_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            ((intrusive_ptr_t<so_5::abstract_message_box_t> *)to.m_named_mbox_count,&local_50,
             &local_58,&local_20);
  return;
}

Assistant:

void
ds_mbox_core_stats_t::distribute(
	const mbox_t & distribution_mbox )
	{
		auto stats = m_what.query_stats();

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::mbox_repository(),
				suffixes::named_mbox_count(),
				stats.m_named_mbox_count );
	}